

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void ProcessReleaseList(SstStream Stream,ReturnMetadataInfo Metadata)

{
  uint uVar1;
  CP_DP_PerReaderReleaseTimestepFunc p_Var2;
  ulong uVar3;
  CPTimestepList p_Var4;
  long lVar5;
  long lVar6;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  if (0 < Metadata->ReleaseCount) {
    lVar5 = 0;
    do {
      p_Var4 = Stream->QueuedTimesteps;
      CP_verbose(Stream,TraceVerbose,"Release List, TS %zd\n",Metadata->ReleaseList[lVar5].Timestep)
      ;
      for (; p_Var4 != (CPTimestepList)0x0; p_Var4 = p_Var4->Next) {
        lVar6 = p_Var4->Timestep;
        if (lVar6 == Metadata->ReleaseList[lVar5].Timestep) {
          uVar1 = Stream->ReaderCount;
          if ((int)uVar1 < 1) {
            uVar3 = 0;
          }
          else {
            uVar3 = 0;
            do {
              if (Stream->Readers[uVar3]->RankZeroID == Metadata->ReleaseList[lVar5].Reader)
              goto LAB_0072fe0a;
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
            uVar3 = (ulong)uVar1;
          }
LAB_0072fe0a:
          uVar3 = uVar3 & 0xffffffff;
          if (Stream->Readers[uVar3]->LastReleasedTimestep < lVar6) {
            CP_verbose(Stream,TraceVerbose,"Updating reader %d last released to %zd\n",uVar3);
            Stream->Readers[uVar3]->LastReleasedTimestep = p_Var4->Timestep;
            lVar6 = Metadata->ReleaseList[lVar5].Timestep;
          }
          CP_verbose(Stream,TraceVerbose,"Release List, and set ref count of timestep %zd\n",lVar6);
          p_Var2 = Stream->DP_Interface->readerReleaseTimestep;
          if (p_Var2 != (CP_DP_PerReaderReleaseTimestepFunc)0x0) {
            (*p_Var2)(&Svcs,Stream->Readers[uVar3]->DP_WSR_Stream,p_Var4->Timestep);
          }
          p_Var4->ReferenceCount = 0;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < Metadata->ReleaseCount);
  }
  QueueMaintenance(Stream);
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  return;
}

Assistant:

static void ProcessReleaseList(SstStream Stream, ReturnMetadataInfo Metadata)
{
    STREAM_MUTEX_LOCK(Stream);
    for (int i = 0; i < Metadata->ReleaseCount; i++)
    {
        CPTimestepList List = Stream->QueuedTimesteps;
        CP_verbose(Stream, TraceVerbose, "Release List, TS %zd\n",
                   Metadata->ReleaseList[i].Timestep);
        while (List)
        {
            if (List->Timestep == Metadata->ReleaseList[i].Timestep)
            {
                /* find local reader that matches global reader and notify local
                 * DP of release */
                int j;
                for (j = 0; j < Stream->ReaderCount; j++)
                {
                    if (Stream->Readers[j]->RankZeroID == Metadata->ReleaseList[i].Reader)
                    {
                        break;
                    }
                }
                assert(j < Stream->ReaderCount);
                if (List->Timestep > Stream->Readers[j]->LastReleasedTimestep)
                {
                    CP_verbose(Stream, TraceVerbose, "Updating reader %d last released to %zd\n", j,
                               List->Timestep);
                    Stream->Readers[j]->LastReleasedTimestep = List->Timestep;
                }
                CP_verbose(Stream, TraceVerbose,
                           "Release List, and set ref count of timestep %zd\n",
                           Metadata->ReleaseList[i].Timestep);
                /* per reader release here */
                if (Stream->DP_Interface->readerReleaseTimestep)
                {
                    (Stream->DP_Interface->readerReleaseTimestep)(
                        &Svcs, Stream->Readers[j]->DP_WSR_Stream, List->Timestep);
                }

                List->ReferenceCount = 0;
            }
            List = List->Next;
        }
    }
    QueueMaintenance(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
}